

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdh.c
# Opt level: O1

int mbedtls_ecdh_compute_shared
              (mbedtls_ecp_group *grp,mbedtls_mpi *z,mbedtls_ecp_point *Q,mbedtls_mpi *d,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  int iVar2;
  mbedtls_ecp_point P;
  mbedtls_ecp_point local_78;
  
  mbedtls_ecp_point_init(&local_78);
  iVar1 = mbedtls_ecp_check_pubkey(grp,Q);
  if ((iVar1 == 0) && (iVar1 = mbedtls_ecp_mul(grp,&local_78,d,Q,f_rng,p_rng), iVar1 == 0)) {
    iVar2 = mbedtls_ecp_is_zero(&local_78);
    iVar1 = -0x4f80;
    if (iVar2 == 0) {
      iVar1 = mbedtls_mpi_copy(z,&local_78.X);
    }
  }
  mbedtls_ecp_point_free(&local_78);
  return iVar1;
}

Assistant:

int mbedtls_ecdh_compute_shared( mbedtls_ecp_group *grp, mbedtls_mpi *z,
                         const mbedtls_ecp_point *Q, const mbedtls_mpi *d,
                         int (*f_rng)(void *, unsigned char *, size_t),
                         void *p_rng )
{
    int ret;
    mbedtls_ecp_point P;

    mbedtls_ecp_point_init( &P );

    /*
     * Make sure Q is a valid pubkey before using it
     */
    MBEDTLS_MPI_CHK( mbedtls_ecp_check_pubkey( grp, Q ) );

    MBEDTLS_MPI_CHK( mbedtls_ecp_mul( grp, &P, d, Q, f_rng, p_rng ) );

    if( mbedtls_ecp_is_zero( &P ) )
    {
        ret = MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
        goto cleanup;
    }

    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( z, &P.X ) );

cleanup:
    mbedtls_ecp_point_free( &P );

    return( ret );
}